

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPInform.cpp
# Opt level: O1

snmp_request_id_t
queue_and_send_trap(list<InformItem_*,_std::allocator<InformItem_*>_> *informList,SNMPTrap *trap,
                   IPAddress *ip,bool replaceQueuedRequests,int retries,int delay_ms)

{
  size_t *psVar1;
  ComplexType *pCVar2;
  bool bVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  snmp_request_id_t sVar6;
  uint8_t _packetBuffer [1400];
  _Any_data local_5c8;
  code *local_5b8;
  code *pcStack_5b0;
  undefined1 local_5a8 [1400];
  
  bVar3 = SNMPTrap::buildForSending(trap);
  if (bVar3) {
    if (replaceQueuedRequests) {
      local_5c8._8_8_ = 0;
      pcStack_5b0 = std::
                    _Function_handler<bool_(InformItem_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/src/SNMPInform.cpp:36:45)>
                    ::_M_invoke;
      local_5b8 = std::
                  _Function_handler<bool_(InformItem_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/src/SNMPInform.cpp:36:45)>
                  ::_M_manager;
      local_5c8._M_unused._M_object = trap;
      remove_inform_from_list(informList,(function<bool_(InformItem_*)> *)&local_5c8);
      if (local_5b8 != (code *)0x0) {
        (*local_5b8)((_Any_data *)&local_5c8,(_Any_data *)&local_5c8,__destroy_functor);
      }
    }
    if (trap->inform == true) {
      p_Var4 = (_List_node_base *)calloc(1,0x48);
      p_Var4[1]._M_next = (_List_node_base *)(long)delay_ms;
      *(undefined1 *)&p_Var4[1]._M_prev = 0;
      p_Var4->_M_next = (_List_node_base *)(trap->super_SNMPPacket).requestID;
      *(int *)&p_Var4->_M_prev = retries;
      *(anon_union_4_2_f7112644_for__address *)&p_Var4[2]._M_prev = ip->_address;
      p_Var4[3]._M_next = (_List_node_base *)0x0;
      p_Var4[3]._M_prev = (_List_node_base *)trap;
      *(undefined1 *)&p_Var4[4]._M_next = 0;
      p_Var5 = (_List_node_base *)operator_new(0x18);
      p_Var5[1]._M_next = p_Var4;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(informList->super__List_base<InformItem_*,_std::allocator<InformItem_*>_>)._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if ((trap->_udp != (UDP *)0x0) &&
         (pCVar2 = (trap->super_SNMPPacket).packet, pCVar2 != (ComplexType *)0x0)) {
        memset(local_5a8,0,0x578);
        (*(pCVar2->super_BER_CONTAINER)._vptr_BER_CONTAINER[2])(pCVar2,local_5a8,0x578);
      }
    }
    else {
      SNMPTrap::sendTo(trap,ip,false);
    }
    sVar6 = (trap->super_SNMPPacket).requestID;
  }
  else {
    sVar6 = 0;
  }
  return sVar6;
}

Assistant:

snmp_request_id_t
queue_and_send_trap(std::list<struct InformItem *> &informList, SNMPTrap *trap, const IPAddress& ip, bool replaceQueuedRequests,
                    int retries, int delay_ms) {
    bool buildStatus = trap->buildForSending();
    if(!buildStatus) {
        SNMP_LOGW("Couldn't build trap\n");
        return INVALID_SNMP_REQUEST_ID;
    };
    SNMP_LOGD("%lu informs in informList", informList.size());
    //TODO: could be race condition here, buildStatus to return packet?
    if(replaceQueuedRequests){
        SNMP_LOGD("Removing any outstanding informs for this trap\n");
        remove_inform_from_list(informList, [trap](struct InformItem* informItem) -> bool {
            return informItem->trap == trap;
        });
    }

    if(trap->inform){
        struct InformItem* item = (struct InformItem*)calloc(1, sizeof(struct InformItem));
        item->delay_ms = delay_ms;
        item->received = false;
        item->requestID = trap->requestID;
        item->retries = retries;
        item->ip = ip;
        item->lastSent = millis();
        item->trap = trap;
        item->missed = false;

        SNMP_LOGD("Adding Inform request to queue: %lu\n", item->requestID);

        informList.push_back(item);

        trap->sendTo(ip, true);
    } else {
        // normal send
        SNMP_LOGD("Sending normal trap\n");
        trap->sendTo(ip);
    }

    return trap->requestID;
}